

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus AddThumbPredicate(cs_struct *ud,MCInst *MI)

{
  ushort uVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  DecodeStatus extraout_EAX;
  MCOperand *pMVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  MCOperandInfo *m;
  
  uVar3 = MCInst_getOpcode(MI);
  uVar7 = 0xe;
  if ((((uVar3 - 0xa98 < 0x35) && ((0x1000100000010dU >> ((ulong)(uVar3 - 0xa98) & 0x3f) & 1) != 0))
      || (uVar3 - 0x90f < 3)) ||
     (((0x3b < uVar3 - 0xa51 || ((0x800000000000005U >> ((ulong)(uVar3 - 0xa51) & 0x3f) & 1) == 0))
      && ((uVar3 != 0x8fc && (uVar3 == 0x904)))))) {
    uVar3 = (ud->ITBlock).size;
    if (uVar3 == 0) {
      return MCDisassembler_Fail;
    }
  }
  else {
    uVar3 = (ud->ITBlock).size;
    if (uVar3 == 0) goto LAB_001469b5;
  }
  bVar6 = (ud->ITBlock).ITStates[uVar3 - 1];
  if (bVar6 == 0xf) {
    bVar6 = 0xe;
  }
  uVar7 = (uint)bVar6;
  (ud->ITBlock).size = uVar3 - 1;
LAB_001469b5:
  uVar3 = MCInst_getOpcode(MI);
  m = ARMInsts[uVar3].OpInfo;
  uVar3 = MCInst_getOpcode(MI);
  uVar1 = ARMInsts[uVar3].NumOperands;
  uVar3 = (uint)uVar1;
  uVar8 = 0;
  do {
    if (uVar1 == uVar8) {
LAB_00146a12:
      pMVar5 = MCOperand_CreateImm1(MI,(ulong)uVar7);
      MCInst_insert0(MI,uVar3,pMVar5);
      pMVar5 = MCOperand_CreateReg1(MI,(uint)(uVar7 != 0xe) * 3);
      MCInst_insert0(MI,uVar3 + 1,pMVar5);
      return extraout_EAX;
    }
    uVar4 = MCInst_getNumOperands(MI);
    if ((uVar8 == uVar4) || (_Var2 = MCOperandInfo_isPredicate(m), _Var2)) {
      uVar3 = (uint)uVar8;
      goto LAB_00146a12;
    }
    uVar8 = uVar8 + 1;
    m = m + 1;
  } while( true );
}

Assistant:

static DecodeStatus AddThumbPredicate(cs_struct *ud, MCInst *MI)
{
	DecodeStatus S = MCDisassembler_Success;
	MCOperandInfo *OpInfo;
	unsigned short NumOps;
	unsigned int i;
	unsigned CC;

	// A few instructions actually have predicates encoded in them.  Don't
	// try to overwrite it if we're seeing one of those.
	switch (MCInst_getOpcode(MI)) {
		case ARM_tBcc:
		case ARM_t2Bcc:
		case ARM_tCBZ:
		case ARM_tCBNZ:
		case ARM_tCPS:
		case ARM_t2CPS3p:
		case ARM_t2CPS2p:
		case ARM_t2CPS1p:
		case ARM_tMOVSr:
		case ARM_tSETEND:
			// Some instructions (mostly conditional branches) are not
			// allowed in IT blocks.
			if (ITStatus_instrInITBlock(&(ud->ITBlock)))
				S = MCDisassembler_SoftFail;
			else
				return MCDisassembler_Success;
			break;
		case ARM_tB:
		case ARM_t2B:
		case ARM_t2TBB:
		case ARM_t2TBH:
			// Some instructions (mostly unconditional branches) can
			// only appears at the end of, or outside of, an IT.
			//if (ITBlock.instrInITBlock() && !ITBlock.instrLastInITBlock())
			if (ITStatus_instrInITBlock(&(ud->ITBlock)) && !ITStatus_instrLastInITBlock(&(ud->ITBlock)))
				S = MCDisassembler_SoftFail;
			break;
		default:
			break;
	}

	// If we're in an IT block, base the predicate on that.  Otherwise,
	// assume a predicate of AL.
	CC = ITStatus_getITCC(&(ud->ITBlock));
	if (CC == 0xF) 
		CC = ARMCC_AL;
	if (ITStatus_instrInITBlock(&(ud->ITBlock)))
		ITStatus_advanceITState(&(ud->ITBlock));

	OpInfo = ARMInsts[MCInst_getOpcode(MI)].OpInfo;
	NumOps = ARMInsts[MCInst_getOpcode(MI)].NumOperands;

	for (i = 0; i < NumOps; ++i) {
		if (i == MCInst_getNumOperands(MI)) break;
		if (MCOperandInfo_isPredicate(&OpInfo[i])) {
			MCInst_insert0(MI, i, MCOperand_CreateImm1(MI, CC));
			if (CC == ARMCC_AL)
				MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, 0));
			else
				MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, ARM_CPSR));
			return S;
		}
	}

	MCInst_insert0(MI, i, MCOperand_CreateImm1(MI, CC));
	if (CC == ARMCC_AL)
		MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, 0));
	else
		MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, ARM_CPSR));

	return S;
}